

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

double units::convert<units::unit,units::unit>(double val,unit *start,unit *result,double baseValue)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  unit *in_RSI;
  unit *in_RDI;
  unit *in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double in_XMM1_Qa;
  double converted_val;
  unit *in_stack_00000060;
  double in_stack_00000068;
  unit_data *in_stack_ffffffffffffff68;
  unit *in_stack_ffffffffffffff70;
  unit *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  bool local_6d;
  unit *val_00;
  double in_stack_fffffffffffffff8;
  
  bVar1 = unit::operator==(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  if (bVar1) {
    return (double)in_XMM0_Qa;
  }
  bVar1 = is_default(in_stack_ffffffffffffff70);
  if (bVar1) {
    return (double)in_XMM0_Qa;
  }
  bVar1 = is_default(in_stack_ffffffffffffff70);
  if (bVar1) {
    return (double)in_XMM0_Qa;
  }
  unit::base_units(in_RDI);
  unit::base_units(in_RSI);
  bVar1 = detail::unit_data::operator==
                    ((unit_data *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                     (unit_data *)in_stack_ffffffffffffff78);
  if (bVar1) {
    dVar4 = unit::multiplier(in_RDI);
    dVar5 = unit::multiplier(in_RSI);
    return ((double)in_XMM0_Qa * dVar4) / dVar5;
  }
  bVar1 = unit::is_per_unit((unit *)0x7b39e6);
  bVar2 = unit::is_per_unit((unit *)0x7b39f9);
  if (bVar1 != bVar2) {
    val_00 = in_RDI;
    unit::base_units(in_RSI);
    bVar1 = unit::has_same_base(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    bVar2 = true;
    if (!bVar1) {
      unit_cast(val_00);
      bVar1 = unit::operator==(in_RDI,in_stack_ffffffffffffff70);
      bVar2 = true;
      if (!bVar1) {
        unit_cast(in_RSI);
        bVar2 = unit::operator==(in_RDI,in_stack_ffffffffffffff70);
      }
    }
    if (bVar2 == false) {
      return NAN;
    }
    bVar1 = unit::is_per_unit((unit *)0x7b3b89);
    if (bVar1) {
      in_XMM0_Qa = (unit *)((double)in_XMM0_Qa * in_XMM1_Qa);
    }
    dVar5 = unit::multiplier(val_00);
    dVar5 = (double)in_XMM0_Qa * dVar5;
    dVar4 = unit::multiplier(in_RSI);
    dVar5 = dVar5 / dVar4;
    bVar1 = unit::is_per_unit((unit *)0x7b3bfe);
    if (!bVar1) {
      return dVar5;
    }
    return dVar5 / in_XMM1_Qa;
  }
  bVar1 = unit::has_e_flag((unit *)0x7b3a1a);
  if (!bVar1) {
    bVar1 = unit::has_e_flag((unit *)0x7b3a28);
    local_6d = false;
    if (!bVar1) goto LAB_007b3a65;
  }
  unit::base_units(in_RSI);
  local_6d = unit::has_same_base(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
LAB_007b3a65:
  if (local_6d != false) {
    dVar4 = detail::convertFlaggedUnits<units::unit,units::unit>
                      (in_stack_fffffffffffffff8,in_XMM0_Qa,in_RDI,(double)in_RSI);
    uVar3 = std::isnan(dVar4);
    if ((uVar3 & 1) == 0) {
      return dVar4;
    }
  }
  dVar4 = convert<units::unit,units::unit>
                    (in_stack_00000068,in_stack_00000060,(unit *)converted_val);
  return dVar4;
}

Assistant:

double convert(double val, const UX& start, const UX2& result, double baseValue)
{
    static_assert(
        std::is_same<UX, unit>::value || std::is_same<UX, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    static_assert(
        std::is_same<UX2, unit>::value ||
            std::is_same<UX2, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    if (start == result || is_default(start) || is_default(result)) {
        return val;
    }
    if (start.base_units() == result.base_units()) {
        return val * start.multiplier() / result.multiplier();
    }

    // if the per unit is equivalent, no baseValue is needed so give to first
    // function
    if (start.is_per_unit() == result.is_per_unit()) {
        if ((start.has_e_flag() || result.has_e_flag()) &&
            start.has_same_base(result.base_units())) {
            double converted_val =
                detail::convertFlaggedUnits(val, start, result, baseValue);
            if (!std::isnan(converted_val)) {
                return converted_val;
            }
        }
        return convert(val, start, result);
    }

    if (start.has_same_base(result.base_units()) || pu == unit_cast(start) ||
        pu == unit_cast(result)) {
        if (start.is_per_unit()) {
            val = val * baseValue;
        }
        val = val * start.multiplier() / result.multiplier();
        if (result.is_per_unit()) {
            val /= baseValue;
        }
        return val;
    }
    // this would require two base values which power might be assumed but
    // assuming a base voltage is dangerous
    return constants::invalid_conversion;
}